

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

const_reference __thiscall
google::protobuf::RepeatedField<int>::Get(RepeatedField<int> *this,int index)

{
  int iVar1;
  int *piVar2;
  string *psVar3;
  DescriptorPool *pool;
  DescriptorPool *extraout_RAX;
  DescriptorBuilder *this_00;
  DeferredValidation *in_RCX;
  Tables *tables;
  long lVar4;
  const_reference piVar5;
  ErrorCollector *in_R8;
  int aiStack_28 [4];
  
  piVar5 = aiStack_28;
  lVar4 = (long)index;
  if (index < 0) {
    psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>(lVar4,0,"index >= 0");
  }
  else {
    psVar3 = (string *)0x0;
  }
  if (psVar3 == (string *)0x0) {
    iVar1 = internal::SooRep::size
                      (&this->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    if (index < iVar1) {
      pool = (DescriptorPool *)0x0;
    }
    else {
      pool = (DescriptorPool *)
             absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (lVar4,(long)iVar1,"index < size()");
    }
    if (pool == (DescriptorPool *)0x0) {
      piVar2 = elements(this,(undefined1  [16])
                             ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
      return piVar2 + lVar4;
    }
  }
  else {
    Get();
    pool = extraout_RAX;
  }
  Get();
  this_00 = (DescriptorBuilder *)operator_new(0x170);
  DescriptorBuilder::DescriptorBuilder(this_00,pool,tables,in_RCX,in_R8);
  *(DescriptorBuilder **)piVar5 = this_00;
  return piVar5;
}

Assistant:

inline const Element& RepeatedField<Element>::Get(int index) const
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  ABSL_DCHECK_GE(index, 0);
  ABSL_DCHECK_LT(index, size());
  return elements(is_soo())[index];
}